

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS ref_recon_rsn(REF_GRID ref_grid,REF_INT node,REF_DBL *r,REF_DBL *s,REF_DBL *n)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_DBL *pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  double dVar10;
  REF_DBL dr [3];
  REF_INT nodes [27];
  long local_e8;
  double local_e0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  ulong local_b0;
  REF_INT local_a8 [30];
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  *r = 0.0;
  r[1] = 0.0;
  r[2] = 0.0;
  uVar5 = ref_recon_normal(ref_grid,node,n);
  if (uVar5 == 0) {
    if (((node < 0) || (pRVar2 = ref_cell->ref_adj, pRVar2->nnode <= node)) ||
       (local_e8 = (long)pRVar2->first[(uint)node], local_e8 == -1)) {
LAB_001dc806:
      dVar10 = n[2] * r[2] + *r * *n + n[1] * r[1];
      *r = *r - *n * dVar10;
      r[1] = r[1] - n[1] * dVar10;
      r[2] = r[2] - dVar10 * n[2];
      uVar5 = ref_math_normalize(r);
      if (uVar5 == 0) {
        *s = n[1] * r[2] - r[1] * n[2];
        s[1] = n[2] * *r - r[2] * *n;
        s[2] = *n * r[1] - *r * n[1];
        return 0;
      }
      pcVar9 = "norm r";
      uVar7 = 0x5f7;
    }
    else {
      uVar5 = ref_cell_nodes(ref_cell,pRVar2->item[local_e8].ref,local_a8);
      if (uVar5 == 0) {
        local_b0 = (ulong)(uint)(node * 0xf);
        local_e0 = 2.0;
        do {
          if (0 < ref_cell->node_per) {
            lVar8 = 0;
            do {
              lVar6 = (long)local_a8[lVar8];
              if (local_a8[lVar8] != node) {
                pRVar3 = pRVar1->real;
                local_c8 = pRVar3[lVar6 * 0xf] - pRVar3[local_b0];
                dStack_c0 = pRVar3[lVar6 * 0xf + 1] - pRVar3[local_b0 + 1];
                local_b8 = pRVar3[lVar6 * 0xf + 2] - pRVar3[local_b0 + 2];
                uVar5 = ref_math_normalize(&local_c8);
                if (uVar5 != 0) {
                  pcVar9 = "norm dr";
                  uVar7 = 0x5e7;
                  goto LAB_001dc8a6;
                }
                dVar10 = n[2] * local_b8 + *n * local_c8 + dStack_c0 * n[1];
                if (dVar10 <= -dVar10) {
                  dVar10 = -dVar10;
                }
                if (dVar10 < local_e0) {
                  *r = local_c8;
                  r[1] = dStack_c0;
                  r[2] = local_b8;
                  local_e0 = dVar10;
                }
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < ref_cell->node_per);
          }
          pRVar4 = ref_cell->ref_adj->item;
          local_e8 = (long)pRVar4[(int)local_e8].next;
          if (local_e8 == -1) goto LAB_001dc806;
          uVar5 = ref_cell_nodes(ref_cell,pRVar4[local_e8].ref,local_a8);
        } while (uVar5 == 0);
      }
      pcVar9 = "cell nodes";
      uVar7 = 0x5de;
    }
  }
  else {
    pcVar9 = "norm";
    uVar7 = 0x5dc;
  }
LAB_001dc8a6:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar7,
         "ref_recon_rsn",(ulong)uVar5,pcVar9);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_recon_rsn(REF_GRID ref_grid, REF_INT node, REF_DBL *r,
                                 REF_DBL *s, REF_DBL *n) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
  REF_DBL small_dot, dot;
  REF_DBL dr[3];

  r[0] = 0.0;
  r[1] = 0.0;
  r[2] = 0.0;

  small_dot = 2.0;
  RSS(ref_recon_normal(ref_grid, node, n), "norm");
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      if (node != nodes[cell_node]) {
        dr[0] = ref_node_xyz(ref_node, 0, nodes[cell_node]) -
                ref_node_xyz(ref_node, 0, node);
        dr[1] = ref_node_xyz(ref_node, 1, nodes[cell_node]) -
                ref_node_xyz(ref_node, 1, node);
        dr[2] = ref_node_xyz(ref_node, 2, nodes[cell_node]) -
                ref_node_xyz(ref_node, 2, node);
        RSS(ref_math_normalize(dr), "norm dr");
        dot = ABS(ref_math_dot(dr, n));
        if (dot < small_dot) {
          small_dot = dot;
          r[0] = dr[0];
          r[1] = dr[1];
          r[2] = dr[2];
        }
      }
    }
  }

  dot = ref_math_dot(r, n);
  r[0] -= dot * n[0];
  r[1] -= dot * n[1];
  r[2] -= dot * n[2];
  RSS(ref_math_normalize(r), "norm r");

  ref_math_cross_product(n, r, s);

  return REF_SUCCESS;
}